

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

bool __thiscall Js::FunctionBody::DoInterpreterProfileWithLock(FunctionBody *this)

{
  uint sourceContextId;
  bool bVar1;
  LocalFunctionId functionId;
  
  sourceContextId =
       ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->m_srcInfo
          ).ptr)->sourceContextInfo).ptr)->sourceContextId;
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01441eb0,InterpreterProfilePhase,sourceContextId,
                            functionId);
  if (bVar1) {
    return false;
  }
  bVar1 = DynamicProfileInfo::IsEnabled(this);
  return bVar1;
}

Assistant:

bool FunctionBody::DoInterpreterProfileWithLock() const
    {
#if ENABLE_PROFILE_INFO
        return !PHASE_OFF(InterpreterProfilePhase, this) && DynamicProfileInfo::IsEnabled(this);
#else
        return false;
#endif
    }